

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall
Fossilize::StateRecorder::init_recording_synchronized(StateRecorder *this,DatabaseInterface *iface)

{
  Impl *pIVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  
  pIVar1 = this->impl;
  pIVar1->database_iface = iface;
  (pIVar1->record_data).write_database_entries = true;
  (pIVar1->record_data).payload_flags = 0;
  (pIVar1->record_data).need_flush = false;
  (pIVar1->record_data).need_prepare = true;
  puVar2 = (pIVar1->record_data).blob.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pIVar1->record_data).blob.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pIVar1->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->record_data).blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
  }
  pIVar1 = this->impl;
  if (pIVar1->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = pIVar1->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar1->should_record_identifier_only = bVar4;
  return;
}

Assistant:

void StateRecorder::init_recording_synchronized(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;
}